

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

LoopHeader * __thiscall
Js::InterpreterStackFrame::DoLoopBodyStart
          (InterpreterStackFrame *this,uint32 loopNumber,LayoutSize layoutSize,
          bool doProfileLoopCheck,bool isFirstIteration)

{
  undefined1 *puVar1;
  byte *pbVar2;
  undefined2 uVar3;
  FunctionBody *this_00;
  NativeCodeGenerator *pNVar4;
  code *pcVar5;
  bool bVar6;
  State SVar7;
  uint32 uVar8;
  int iVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  RegSlot RVar12;
  RegSlot RVar13;
  uint uVar14;
  OpLayoutType OVar15;
  uint uVar16;
  undefined4 *puVar17;
  LoopHeader *this_01;
  LoopEntryPointInfo *this_02;
  undefined4 extraout_var;
  Var pvVar18;
  void *pvVar19;
  ulong uVar20;
  InterpreterStackFrame *pIVar21;
  uint uVar22;
  uint32 uVar23;
  undefined1 local_70 [8];
  AutoRestoreLoopNumbers autoRestore;
  
  this_00 = *(FunctionBody **)(this + 0x88);
  autoRestore.loopNumber = layoutSize;
  uVar8 = FunctionBody::GetCountField(this_00,LoopCount);
  if (uVar8 <= loopNumber) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x17a3,"(loopNumber < fn->GetLoopCount())",
                                "loopNumber < fn->GetLoopCount()");
    if (!bVar6) goto LAB_00a554cd;
    *puVar17 = 0;
  }
  if (((byte)this[0xd4] & 6) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x17a4,"(!this->IsInCatchOrFinallyBlock())",
                                "!this->IsInCatchOrFinallyBlock()");
    if (!bVar6) goto LAB_00a554cd;
    *puVar17 = 0;
  }
  this_01 = FunctionBody::GetLoopHeader(this_00,loopNumber);
  uVar3 = *(undefined2 *)(this + 0xd4);
  this_01->isInTry = (Type)((byte)uVar3 & 1);
  this_01->isInTryFinally = (Type)((byte)((ushort)uVar3 >> 8) & 1);
  this_02 = LoopHeader::GetCurrentEntryPointInfo(this_01);
  bVar6 = FunctionProxy::IsJitLoopBodyPhaseForced((FunctionProxy *)this_00);
  if (((((bVar6) && (((this_00->super_ParseableFunctionInfo).flags & Flags_HasTry) == Flags_None))
       && (this_01->interpretCount == 0)) &&
      ((this_02 != (LoopEntryPointInfo *)0x0 && (this_01->hasYield == false)))) &&
     (SVar7 = EntryPointInfo::GetState(&this_02->super_EntryPointInfo), SVar7 == NotScheduled)) {
    bVar6 = DynamicProfileInfo::EnableImplicitCallFlags(*(FunctionBody **)(this + 0x88));
    if (bVar6) {
      pbVar2 = (byte *)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x1570);
      *pbVar2 = *pbVar2 | *(byte *)(*(long *)(this + 0xc0) + (ulong)loopNumber);
    }
    pNVar4 = *(NativeCodeGenerator **)(*(long *)(this + 0x78) + 0x12a0);
    RVar10 = FunctionBody::GetLocalsCount(this_00);
    GenerateLoopBody(pNVar4,this_00,this_01,&this_02->super_EntryPointInfo,RVar10,
                     (Var *)(this + 0x160));
  }
  if ((this_02 == (LoopEntryPointInfo *)0x0) ||
     (SVar7 = EntryPointInfo::GetState(&this_02->super_EntryPointInfo), SVar7 != CodeGenDone)) {
    this_01->interpretCount = this_01->interpretCount + (uint)!isFirstIteration;
    uVar16 = FunctionBody::GetLoopInterpretCount(*(FunctionBody **)(this + 0x88),this_01);
    uVar14 = this_01->interpretCount;
    if (uVar16 < uVar14) {
      if ((*(char *)(*(long *)(this + 0x78) + 0x1250) == '\0') &&
         (bVar6 = FunctionBody::DoJITLoopBody(this_00), bVar6)) {
        if (this_02 == (LoopEntryPointInfo *)0x0) {
          return (LoopHeader *)0x0;
        }
        if (this_01->hasYield != false) {
          return (LoopHeader *)0x0;
        }
        SVar7 = EntryPointInfo::GetState(&this_02->super_EntryPointInfo);
        if (SVar7 == NotScheduled) {
          pNVar4 = *(NativeCodeGenerator **)(*(long *)(this + 0x78) + 0x12a0);
          RVar10 = FunctionBody::GetLocalsCount(this_00);
          GenerateLoopBody(pNVar4,this_00,this_01,&this_02->super_EntryPointInfo,RVar10,
                           (Var *)(this + 0x160));
        }
      }
    }
    else {
      if (!doProfileLoopCheck) {
        return (LoopHeader *)0x0;
      }
      if (((byte)this[0xd6] & 0x10) == 0) {
        return (LoopHeader *)0x0;
      }
      uVar16 = FunctionBody::GetLoopProfileThreshold(this_00,uVar16);
      if (uVar14 <= uVar16) {
        return (LoopHeader *)0x0;
      }
      if (((byte)this[0xd6] & 8) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1890,"(!switchProfileMode)","!switchProfileMode");
        if (!bVar6) goto LAB_00a554cd;
        *puVar17 = 0;
      }
      this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] | 8);
      if (*(int *)(this + 0xd8) != -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1892,"(switchProfileModeOnLoopEndNumber == 0u - 1)",
                                    "switchProfileModeOnLoopEndNumber == 0u - 1");
        if (!bVar6) goto LAB_00a554cd;
        *puVar17 = 0;
      }
      *(uint32 *)(this + 0xd8) = loopNumber;
    }
    return (LoopHeader *)0x0;
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_015cd718,JITLoopBodyPhase);
  if ((bVar6) && (DAT_015d346a == '\x01')) {
    FunctionBody::DumpFunctionId(this_00,true);
    iVar9 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_00);
    Output::Print(L": %-20s LoopBody Execute  Loop: %2d\n",CONCAT44(extraout_var,iVar9),
                  (ulong)loopNumber);
    Output::Flush();
  }
  this_01->nativeCount = this_01->nativeCount + 1;
  this_02->used = true;
  EntryPointInfo::EnsureIsReadyToCall(&this_02->super_EntryPointInfo);
  puVar1 = &(this_02->super_EntryPointInfo).field_0x18;
  *puVar1 = *puVar1 | 0x10;
  autoRestore._12_4_ = FunctionBody::GetEnvRegister(*(FunctionBody **)(this + 0x88));
  uVar20 = (ulong)(uint)autoRestore._12_4_;
  if (autoRestore._12_4_ != 0xffffffff) {
    *(undefined8 *)(this + uVar20 * 8 + 0x160) = *(undefined8 *)(*(long *)(this + 0x80) + 0x30);
  }
  RVar10 = FunctionBody::GetLocalClosureRegister(*(FunctionBody **)(this + 0x88));
  RVar11 = FunctionBody::GetLocalFrameDisplayRegister(*(FunctionBody **)(this + 0x88));
  RVar12 = FunctionBody::GetParamClosureRegister(*(FunctionBody **)(this + 0x88));
  if (((this_02->super_EntryPointInfo).field_0x18 & 4) == 0) {
    if (RVar10 != 0xffffffff) {
      *(undefined8 *)(this + (ulong)RVar10 * 8 + 0x160) = *(undefined8 *)(this + 0x58);
    }
    if (RVar11 != 0xffffffff) {
      *(undefined8 *)(this + (ulong)RVar11 * 8 + 0x160) = *(undefined8 *)(this + 0x50);
    }
    if (RVar12 != 0xffffffff) {
      pIVar21 = *(InterpreterStackFrame **)(this + 0x60);
LAB_00a55199:
      *(InterpreterStackFrame **)(this + (ulong)RVar12 * 8 + 0x160) = pIVar21;
    }
  }
  else {
    if (RVar10 != 0xffffffff) {
      *(InterpreterStackFrame **)(this + (ulong)RVar10 * 8 + 0x160) = this + 0x58;
    }
    if (RVar11 != 0xffffffff) {
      *(InterpreterStackFrame **)(this + (ulong)RVar11 * 8 + 0x160) = this + 0x50;
    }
    if (RVar12 != 0xffffffff) {
      pIVar21 = this + 0x60;
      goto LAB_00a55199;
    }
  }
  uVar8 = FunctionBody::GetCountField(*(FunctionBody **)(this + 0x88),InnerScopeCount);
  if (uVar8 != 0) {
    uVar23 = 0;
    do {
      RVar13 = FunctionBody::GetFirstInnerScopeRegister(*(FunctionBody **)(this + 0x88));
      pvVar18 = InnerScopeFromIndex(this,uVar23);
      *(Var *)(this + (ulong)(RVar13 + uVar23) * 8 + 0x160) = pvVar18;
      uVar23 = uVar23 + 1;
    } while (uVar8 != uVar23);
  }
  if (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
    DoLoopBodyStart(unsigned_int,Js::LayoutSize,bool,bool)::AutoRestoreLoopNumbers::
    AutoRestoreLoopNumbers(Js::InterpreterStackFrame__unsigned_int_bool_
              (local_70,this,loopNumber,doProfileLoopCheck);
    pvVar19 = (*(this_02->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod)
                        (*(RecyclableObject **)(this + 0x80),
                         (CallInfo)*(RecyclableObject **)(this + 0x80),0x80000001,0,0,0,0,0x80000001
                         ,this);
    uVar14 = ::Math::PointerCastToIntegral<unsigned_int>(pvVar19);
  }
  else {
    DoLoopBodyStart(unsigned_int,Js::LayoutSize,bool,bool)::AutoRestoreLoopNumbers::
    AutoRestoreLoopNumbers(Js::InterpreterStackFrame__unsigned_int_bool_
              (local_70,this,loopNumber,doProfileLoopCheck);
    pvVar19 = (*(this_02->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod)
                        (*(RecyclableObject **)(this + 0x80),
                         (CallInfo)*(RecyclableObject **)(this + 0x80),0x80000001,0,0,0,0,0x80000001
                         ,this);
    uVar14 = ::Math::PointerCastToIntegral<unsigned_int>(pvVar19);
  }
  DoLoopBodyStart::AutoRestoreLoopNumbers::~AutoRestoreLoopNumbers
            ((AutoRestoreLoopNumbers *)local_70);
  if (autoRestore._12_4_ != -1) {
    *(undefined8 *)(this + uVar20 * 8 + 0x160) = 0;
  }
  if (RVar10 != 0xffffffff) {
    *(undefined8 *)(this + (ulong)RVar10 * 8 + 0x160) = 0;
  }
  if (RVar11 != 0xffffffff) {
    *(undefined8 *)(this + (ulong)RVar11 * 8 + 0x160) = 0;
  }
  if (RVar12 != 0xffffffff) {
    *(undefined8 *)(this + (ulong)RVar12 * 8 + 0x160) = 0;
  }
  if (uVar8 != 0) {
    uVar23 = 0;
    do {
      RVar10 = FunctionBody::GetFirstInnerScopeRegister(*(FunctionBody **)(this + 0x88));
      SetInnerScopeFromIndex(this,uVar23,*(Var *)(this + (ulong)(RVar10 + uVar23) * 8 + 0x160));
      *(undefined8 *)(this + (ulong)(RVar10 + uVar23) * 8 + 0x160) = 0;
      uVar23 = uVar23 + 1;
    } while (uVar8 != uVar23);
  }
  OVar15 = OpCodeUtil::GetOpCodeLayout(ProfiledLoopBodyStart);
  if (OVar15._value != 0x4d) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1833,
                                "(Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1)"
                                ,
                                "Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1"
                               );
    if (!bVar6) goto LAB_00a554cd;
    *puVar17 = 0;
  }
  OVar15 = OpCodeUtil::GetOpCodeLayout(LoopBodyStart);
  if (OVar15._value != 0x4d) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1834,
                                "(Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1)"
                                ,
                                "Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1"
                               );
    if (!bVar6) {
LAB_00a554cd:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar17 = 0;
  }
  iVar9 = -(uint)(autoRestore.loopNumber == 0);
  if (autoRestore.loopNumber == 1) {
    uVar22 = iVar9 + 4;
  }
  else if (autoRestore.loopNumber == 0) {
    uVar22 = iVar9 + 3;
  }
  else {
    uVar22 = iVar9 + 2U | 4;
  }
  if ((uVar14 == this_01->startOffset) ||
     (uVar16 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this), uVar14 == uVar16 - uVar22))
  {
    this_01->interpretCount = this_01->interpretCount + 1;
  }
  else {
    CheckIfLoopIsHot(this,this_01->profiledLoopCounter);
    if (this_01->endOffset <= uVar14) {
      uVar22 = ((_DAT_015c7950 + 1U & 0xff) - 1) * (uint)(byte)DAT_015c7954;
      if (this_02->totalJittedLoopIterations <= uVar22) {
        uVar22 = this_02->totalJittedLoopIterations;
      }
      this_02->totalJittedLoopIterations = uVar22 & 0xff;
      this_02->jittedLoopIterationsSinceLastBailout = 0;
    }
    ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,uVar14);
  }
  return this_01;
}

Assistant:

LoopHeader const * InterpreterStackFrame::DoLoopBodyStart(uint32 loopNumber, LayoutSize layoutSize, const bool doProfileLoopCheck, const bool isFirstIteration)
    {
#if ENABLE_PROFILE_INFO
        class AutoRestoreLoopNumbers
        {
        private:
            InterpreterStackFrame * const interpreterStackFrame;
            uint32 loopNumber;
            bool doProfileLoopCheck;

        public:
            AutoRestoreLoopNumbers(InterpreterStackFrame *const interpreterStackFrame, uint32 loopNumber, bool doProfileLoopCheck)
                : interpreterStackFrame(interpreterStackFrame), loopNumber(loopNumber), doProfileLoopCheck(doProfileLoopCheck)
            {
                Assert(interpreterStackFrame->currentLoopNum == LoopHeader::NoLoop);
                interpreterStackFrame->currentLoopNum = loopNumber;
                interpreterStackFrame->m_functionBody->SetRecentlyBailedOutOfJittedLoopBody(false);
            }

            ~AutoRestoreLoopNumbers()
            {
                interpreterStackFrame->currentLoopNum = LoopHeader::NoLoop;
                interpreterStackFrame->currentLoopCounter = 0;
                Js::FunctionBody* fn = interpreterStackFrame->m_functionBody;
                if (fn->RecentlyBailedOutOfJittedLoopBody())
                {
                    if (doProfileLoopCheck && interpreterStackFrame->isAutoProfiling)
                    {
                        // Start profiling the loop after a bailout. Some bailouts require subsequent profile data collection such
                        // that the rejitted loop body would not bail out again for the same reason.
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        Assert(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1);
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = loopNumber;
                    }
                }
                else
                {
                    if (interpreterStackFrame->switchProfileModeOnLoopEndNumber == loopNumber)
                    {
                        // Stop profiling since the jitted loop body would be exiting the loop
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = 0u - 1;
                    }

                    interpreterStackFrame->scriptContext->GetThreadContext()->DecrementLoopDepth();
                }
            }
        };
#endif

        Js::FunctionBody* fn = this->m_functionBody;

        Assert(loopNumber < fn->GetLoopCount());
        Assert(!this->IsInCatchOrFinallyBlock());

        Js::LoopHeader *loopHeader = fn->GetLoopHeader(loopNumber);
        loopHeader->isInTry = this->TestFlags(Js::InterpreterStackFrameFlags_WithinTryBlock);
        loopHeader->isInTryFinally = this->TestFlags(Js::InterpreterStackFrameFlags_WithinTryFinallyBlock);

        Js::LoopEntryPointInfo * entryPointInfo = loopHeader->GetCurrentEntryPointInfo();

        if (fn->ForceJITLoopBody() && loopHeader->interpretCount == 0 && loopHeader->hasYield == false &&
            (entryPointInfo != NULL && entryPointInfo->IsNotScheduled()))
        {
#if ENABLE_PROFILE_INFO
            if (Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))
            {
                scriptContext->GetThreadContext()->AddImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);
            }
#endif

#if ENABLE_NATIVE_CODEGEN
            GenerateLoopBody(scriptContext->GetNativeCodeGenerator(), fn, loopHeader, entryPointInfo, fn->GetLocalsCount(), this->m_localSlots);
#endif
        }

#if ENABLE_NATIVE_CODEGEN
        // If we have JITted the loop, call the JITted code
        if (entryPointInfo != NULL && entryPointInfo->IsCodeGenDone())
        {
#if DBG_DUMP
            if (PHASE_TRACE1(Js::JITLoopBodyPhase) && CONFIG_FLAG(Verbose))
            {
                fn->DumpFunctionId(true);
                Output::Print(_u(": %-20s LoopBody Execute  Loop: %2d\n"), fn->GetDisplayName(), loopNumber);
                Output::Flush();
            }
            loopHeader->nativeCount++;
#endif
#ifdef BGJIT_STATS
            entryPointInfo->MarkAsUsed();
#endif

            entryPointInfo->EnsureIsReadyToCall();
            entryPointInfo->SetNativeEntryPointProcessed();

            RegSlot envReg = this->m_functionBody->GetEnvRegister();
            if (envReg != Constants::NoRegister)
            {
                this->SetNonVarReg(envReg, this->LdEnv());
            }

            RegSlot localClosureReg = this->m_functionBody->GetLocalClosureRegister();
            RegSlot localFrameDisplayReg = this->m_functionBody->GetLocalFrameDisplayRegister();
            RegSlot paramClosureReg = this->m_functionBody->GetParamClosureRegister();

            if (entryPointInfo->HasJittedStackClosure())
            {
                // The jitted code is expecting the closure registers to point to known stack locations where
                // the closures can be found and possibly boxed.
                // In a jitted loop body, those locations are the local closure fields on the interpreter instance.
                if (localClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localClosureReg, &this->localClosure);
                }

                if (localFrameDisplayReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localFrameDisplayReg, &this->localFrameDisplay);
                }

                if (paramClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(paramClosureReg, &this->paramClosure);
                }
            }
            else
            {
                // In non-stack-closure jitted code, the closure registers are expected to hold the addresses
                // of the actual structures.
                if (localClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localClosureReg, this->localClosure);
                }

                if (localFrameDisplayReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localFrameDisplayReg, this->localFrameDisplay);
                }

                if (paramClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(paramClosureReg, this->paramClosure);
                }
            }

            uint32 innerScopeCount = this->m_functionBody->GetInnerScopeCount();
            for (uint32 i = 0; i < innerScopeCount; i++)
            {
                // As with the function-level scope, transfer the inner scopes from the interpreter's side storage
                // to their dedicated register slots.
                SetNonVarReg(this->m_functionBody->GetFirstInnerScopeRegister() + i, InnerScopeFromIndex(i));
            }

            uint newOffset = 0;
            if (fn->GetIsAsmJsFunction())
            {
                AutoRestoreLoopNumbers autoRestore(this, loopNumber, doProfileLoopCheck);
                newOffset = this->CallAsmJsLoopBody(entryPointInfo->jsMethod);
            }
            else
            {
                AutoRestoreLoopNumbers autoRestore(this, loopNumber, doProfileLoopCheck);
                newOffset = this->CallLoopBody(entryPointInfo->jsMethod);
            }

            if (envReg != Constants::NoRegister)
            {
                SetNonVarReg(envReg, nullptr);
            }

            if (localClosureReg != Constants::NoRegister)
            {
                SetNonVarReg(localClosureReg, nullptr);
            }

            if (localFrameDisplayReg != Constants::NoRegister)
            {
                SetNonVarReg(localFrameDisplayReg, nullptr);
            }

            if (paramClosureReg != Constants::NoRegister)
            {
                SetNonVarReg(paramClosureReg, nullptr);
            }

            for (uint32 i = 0; i < innerScopeCount; i++)
            {
                // Get the (possibly updated) scopes from their registers and put them back in side storage.
                // (Getting the updated values may not be necessary, actually, but it can't hurt.)
                // Then null out the registers.
                RegSlot reg = this->m_functionBody->GetFirstInnerScopeRegister() + i;
                SetInnerScopeFromIndex(i, GetNonVarReg(reg));
                SetNonVarReg(reg, nullptr);
            }

            Assert(Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1);
            Assert(Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1);
            Assert(Js::OpCodeUtil::EncodedSize(Js::OpCode::LoopBodyStart, layoutSize) == Js::OpCodeUtil::EncodedSize(Js::OpCode::ProfiledLoopBodyStart, layoutSize));
            uint byteCodeSize = Js::OpCodeUtil::EncodedSize(Js::OpCode::LoopBodyStart, layoutSize);
            if (layoutSize == SmallLayout)
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Small);
            }
            else if (layoutSize == MediumLayout)
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Medium);
            }
            else
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Large);
            }

            if (newOffset == loopHeader->startOffset || newOffset == m_reader.GetCurrentOffset() - byteCodeSize)
            {
                // If we bail out back the start of the loop, or start of this LoopBodyStart just skip and interpret the loop
                // instead of trying to start the loop body again

                // Increment the interpret count of the loop
                loopHeader->interpretCount++;
            }
            else
            {
                this->CheckIfLoopIsHot(loopHeader->profiledLoopCounter);

                if (newOffset >= loopHeader->endOffset)
                {
                    // Reset the totalJittedLoopIterations for the next invocation of this loop entry point
                    entryPointInfo->totalJittedLoopIterations =
                        static_cast<uint8>(
                            min(
                                static_cast<uint>(static_cast<uint8>(CONFIG_FLAG(MinBailOutsBeforeRejit))) *
                                (Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout() - 1),
                                entryPointInfo->totalJittedLoopIterations));
                    entryPointInfo->jittedLoopIterationsSinceLastBailout = 0;
                }
                m_reader.SetCurrentOffset(newOffset);
            }

            return loopHeader;
        }
#endif

        // Increment the interpret count of the loop
        loopHeader->interpretCount += !isFirstIteration;

        const uint loopInterpretCount = GetFunctionBody()->GetLoopInterpretCount(loopHeader);
        if (loopHeader->interpretCount > loopInterpretCount)
        {
            if (this->scriptContext->GetConfig()->IsNoNative())
            {
                return nullptr;
            }

            if (!fn->DoJITLoopBody() || loopHeader->hasYield)
            {
                return nullptr;
            }

#if ENABLE_NATIVE_CODEGEN
#if ENABLE_OOP_NATIVE_CODEGEN
            // If for some reason OOP JIT isn't connected (e.g. it crashed), don't attempt to JIT a loop body
            if (JITManager::GetJITManager()->IsOOPJITEnabled() && !JITManager::GetJITManager()->IsConnected())
            {
                return nullptr;
            }
#endif
            // If the job is not scheduled then we need to schedule it now.
            // It is possible a job was scheduled earlier and we find ourselves looking at the same entry point
            // again. For example, if the function with the loop was JITed and bailed out then as we finish
            // the call in the interpreter we might encounter a loop for which we had scheduled a JIT job before
            // the function was initially scheduled. In such cases, that old JIT job will complete. If it completes
            // successfully then we can go ahead and use it. If it fails then it will eventually revert to the
            // NotScheduled state. Since transitions from NotScheduled can only occur on the main thread,
            // by checking the state we are safe from racing with the JIT thread when looking at the other fields
            // of the entry point.
            if (entryPointInfo != NULL && entryPointInfo->IsNotScheduled())
            {
                GenerateLoopBody(scriptContext->GetNativeCodeGenerator(), fn, loopHeader, entryPointInfo, fn->GetLocalsCount(), this->m_localSlots);
            }
#endif
        }
#if ENABLE_PROFILE_INFO
        else if (
            doProfileLoopCheck &&
            isAutoProfiling &&
            loopHeader->interpretCount > fn->GetLoopProfileThreshold(loopInterpretCount))
        {
            // Start profiling the loop so that the jitted loop body will have some profile data to use
            Assert(!switchProfileMode);
            switchProfileMode = true;
            Assert(switchProfileModeOnLoopEndNumber == 0u - 1);
            switchProfileModeOnLoopEndNumber = loopNumber;
        }
#endif

        return nullptr;
    }